

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O2

string * anon_unknown.dwarf_3ac368::make_include_path
                   (string *__return_storage_ptr__,string *base_path,string *dest_path)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  sVar1 = std::__cxx11::string::rfind((char)base_path,0x2f);
  if ((sVar1 == base_path->_M_string_length) ||
     ((dest_path->_M_string_length != 0 && (*(dest_path->_M_dataplus)._M_p == '/')))) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)dest_path);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)base_path);
    std::operator+(__return_storage_ptr__,&local_40,dest_path);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string make_include_path(const std::string& base_path, const std::string& dest_path)
{
    size_t last_slash_pos = base_path.find_last_of('/');

    if (last_slash_pos == base_path.length())
    {
        return dest_path;
    }

    if (dest_path.length() >= 1 && dest_path[0] == '/')
    {
        return dest_path;
    }

    return base_path.substr(0, last_slash_pos + 1) + dest_path;
}